

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.c
# Opt level: O3

void hd_run_page_contents(hd_context *ctx,hd_page *page,char *buf,uint32_t *extract_len)

{
  hd_error_stack_slot *phVar1;
  int iVar2;
  
  if ((page != (hd_page *)0x0) && (page->run_page_contents != (hd_page_run_page_contents_fn *)0x0))
  {
    iVar2 = hd_push_try(ctx);
    if (iVar2 != 0) {
      iVar2 = __sigsetjmp(ctx->error->top->buffer,0);
      if (iVar2 == 0) {
        (*page->run_page_contents)(ctx,page,buf,extract_len);
      }
    }
    phVar1 = ctx->error->top;
    ctx->error->top = phVar1 + -1;
    if (1 < phVar1->code) {
      iVar2 = hd_caught(ctx);
      if (iVar2 != 5) {
        hd_rethrow(ctx);
      }
    }
  }
  return;
}

Assistant:

void
hd_run_page_contents(hd_context *ctx, hd_page *page, char* buf, uint32_t *extract_len)
{
    if (page && page->run_page_contents && page)
    {
        hd_try(ctx)
        {
            page->run_page_contents(ctx, page, buf, extract_len);
        }
        hd_catch(ctx)
        {
            if (hd_caught(ctx) != HD_ERROR_ABORT)
                hd_rethrow(ctx);
        }
    }
}